

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* cinatra::split_sv(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *__return_storage_ptr__,string_view s,string_view delimiter)

{
  pointer *ppbVar1;
  iterator __position;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __n;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __n = delimiter._M_len;
  pcVar5 = s._M_str;
  uVar8 = s._M_len;
  if (uVar8 == 0 || __n == 0) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = 0;
    do {
      pvVar3 = memchr(delimiter._M_str,(int)pcVar5[uVar7],__n);
      if (pvVar3 != (void *)0x0) goto LAB_0015526c;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    uVar7 = 0xffffffffffffffff;
  }
LAB_0015526c:
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  do {
    local_40._M_len = uVar8 - uVar6;
    if (uVar7 - uVar6 <= uVar8 - uVar6) {
      local_40._M_len = uVar7 - uVar6;
    }
    local_40._M_str = pcVar5 + uVar6;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,__position,&local_40);
    }
    else {
      (__position._M_current)->_M_len = local_40._M_len;
      (__position._M_current)->_M_str = local_40._M_str;
      ppbVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    if (uVar7 == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    uVar6 = uVar7 + 1;
    uVar4 = 0xffffffffffffffff;
    if ((__n != 0) && (uVar2 = uVar6, uVar6 < uVar8)) {
      do {
        uVar4 = uVar2;
        pvVar3 = memchr(delimiter._M_str,(int)pcVar5[uVar4],__n);
        if (pvVar3 != (void *)0x0) goto LAB_0015531c;
        uVar2 = uVar4 + 1;
      } while (uVar8 != uVar4 + 1);
      uVar4 = 0xffffffffffffffff;
    }
LAB_0015531c:
    bVar9 = uVar8 <= uVar7;
    uVar7 = uVar4;
    if (bVar9) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar6,uVar8);
    }
  } while( true );
}

Assistant:

inline std::vector<std::string_view> split_sv(std::string_view s,
                                              std::string_view delimiter) {
  size_t start = 0;
  size_t end = s.find_first_of(delimiter);

  std::vector<std::string_view> output;

  while (end <= std::string_view::npos) {
    output.emplace_back(s.substr(start, end - start));

    if (end == std::string_view::npos)
      break;

    start = end + 1;
    end = s.find_first_of(delimiter, start);
  }

  return output;
}